

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

void __thiscall PatternBlock::PatternBlock(PatternBlock *this,int4 off,uintm msk,uintm val)

{
  uintm local_1c;
  uintm local_18;
  uintm val_local;
  uintm msk_local;
  int4 off_local;
  PatternBlock *this_local;
  
  local_1c = val;
  local_18 = msk;
  val_local = off;
  _msk_local = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->maskvec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->valvec);
  this->offset = val_local;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->maskvec,&local_18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->valvec,&local_1c);
  this->nonzerosize = 4;
  normalize(this);
  return;
}

Assistant:

PatternBlock::PatternBlock(int4 off,uintm msk,uintm val)

{				// Define mask and value pattern, confined to one uintm
  offset = off;
  maskvec.push_back(msk);
  valvec.push_back(val);
  nonzerosize = sizeof(uintm);	// Assume all non-zero bytes before normalization
  normalize();
}